

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O0

void __thiscall Fl_Browser::hide(Fl_Browser *this,int line)

{
  int iVar1;
  FL_BLINE *item;
  FL_BLINE *t;
  int line_local;
  Fl_Browser *this_local;
  
  item = find_line(this,line);
  if ((item->flags & 2U) == 0) {
    iVar1 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                      (this,item);
    this->full_height_ = this->full_height_ - iVar1;
    item->flags = item->flags | 2;
    iVar1 = Fl_Browser_::displayed(&this->super_Fl_Browser_,item);
    if (iVar1 != 0) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
  }
  return;
}

Assistant:

void Fl_Browser::hide(int line) {
  FL_BLINE* t = find_line(line);
  if (!(t->flags & NOTDISPLAYED)) {
    full_height_ -= item_height(t);
    t->flags |= NOTDISPLAYED;
    if (Fl_Browser_::displayed(t)) redraw();
  }
}